

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O1

size_type __thiscall re2::StringPiece::find(StringPiece *this,char c,size_type pos)

{
  char *pcVar1;
  size_type sVar2;
  char local_9;
  
  sVar2 = 0xffffffffffffffff;
  if (pos < this->size_) {
    local_9 = c;
    pcVar1 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                       (this->data_ + pos,this->data_ + this->size_,&local_9);
    sVar2 = 0xffffffffffffffff;
    if (pcVar1 != this->data_ + this->size_) {
      sVar2 = (long)pcVar1 - (long)this->data_;
    }
  }
  return sVar2;
}

Assistant:

StringPiece::size_type StringPiece::find(char c, size_type pos) const {
  if (size_ <= 0 || pos >= size_) return npos;
  const_pointer result = std::find(data_ + pos, data_ + size_, c);
  return result != data_ + size_ ? result - data_ : npos;
}